

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt * __thiscall slang::SVInt::operator+=(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  uint32_t len;
  SVInt *pSVar2;
  SVInt *in_RSI;
  SVInt *in_RDI;
  SVInt *in_stack_ffffffffffffff70;
  uint64_t *dst;
  SVInt *in_stack_ffffffffffffff78;
  uint64_t *x;
  SVInt *in_stack_ffffffffffffff80;
  bitwidth_t bits;
  uint64_t *y;
  SVInt *in_stack_ffffffffffffff88;
  SVInt *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  SVInt local_38;
  SVInt *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->super_SVIntStorage).bitWidth != (in_RSI->super_SVIntStorage).bitWidth) {
    bVar1 = SUB81((ulong)in_stack_ffffffffffffff80 >> 0x18,0);
    bits = (bitwidth_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if ((in_RSI->super_SVIntStorage).bitWidth <= (in_RDI->super_SVIntStorage).bitWidth) {
      extend(&local_38,bits,bVar1);
      pSVar2 = operator+=(in_RSI,in_stack_ffffffffffffffe0);
      ~SVInt(in_stack_ffffffffffffff80);
      return pSVar2;
    }
    extend(in_stack_ffffffffffffff88,bits,bVar1);
    operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    ~SVInt(in_stack_ffffffffffffff80);
  }
  if ((((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) &&
     (((in_RSI->super_SVIntStorage).unknownFlag & 1U) == 0)) {
    bVar1 = isSingleWord(in_RDI);
    if (bVar1) {
      (in_RDI->super_SVIntStorage).field_0.pVal =
           (uint64_t *)
           ((long)(in_RSI->super_SVIntStorage).field_0.pVal +
           (long)(in_RDI->super_SVIntStorage).field_0.pVal);
    }
    else {
      dst = (in_RDI->super_SVIntStorage).field_0.pVal;
      x = (in_RDI->super_SVIntStorage).field_0.pVal;
      y = (in_RSI->super_SVIntStorage).field_0.pVal;
      len = getNumWords((SVInt *)0x29cb15);
      addGeneral(dst,x,y,len);
    }
    clearUnusedBits((SVInt *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  else {
    setAllX(in_stack_ffffffffffffff90);
  }
  return in_RDI;
}

Assistant:

SVInt& SVInt::operator+=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, signFlag && rhs.signFlag);
        else
            return *this += rhs.extend(bitWidth, signFlag && rhs.signFlag);
    }

    if (unknownFlag || rhs.unknownFlag)
        setAllX();
    else {
        if (isSingleWord())
            val += rhs.val;
        else
            addGeneral(pVal, pVal, rhs.pVal, getNumWords());
        clearUnusedBits();
    }
    return *this;
}